

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::DynamicScene::SceneObject::getTransformation(SceneObject *this)

{
  long in_RSI;
  Vector3D *in_RDI;
  Vector3D rot;
  Vector3D *this_00;
  Vector3D local_480;
  Vector3D *in_stack_fffffffffffffb98;
  Matrix4x4 *in_stack_fffffffffffffba0;
  Matrix4x4 *in_stack_fffffffffffffba8;
  Axis in_stack_fffffffffffffbd4;
  double in_stack_fffffffffffffbd8;
  Vector3D local_268 [22];
  undefined8 local_50;
  undefined8 local_48;
  
  local_48 = 0x400921fb54442d18;
  this_00 = in_RDI;
  Vector3D::operator*(in_RDI,&in_RDI->x);
  local_50 = 0x4066800000000000;
  Vector3D::operator/(this_00,&in_RDI->x);
  Vector3D::Vector3D(local_268,(Vector3D *)(in_RSI + 0x10));
  Matrix4x4::translation(in_stack_fffffffffffffb98);
  Matrix4x4::rotation(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  Matrix4x4::operator*(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  Matrix4x4::rotation(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  Matrix4x4::operator*(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  Matrix4x4::rotation(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  Matrix4x4::operator*(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  Vector3D::Vector3D(&local_480,(Vector3D *)(in_RSI + 0x40));
  Matrix4x4::scaling(in_stack_fffffffffffffb98);
  Matrix4x4::operator*(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  return (Matrix4x4 *)this_00;
}

Assistant:

Matrix4x4 SceneObject::getTransformation() {
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::translation(position) *
         Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X) *
         Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y) *
         Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z) *
         Matrix4x4::scaling(scale);
}